

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# s98c_write.c
# Opt level: O0

int write_s98v2(s98c *ctx,FILE *fp)

{
  uint8_t *puVar1;
  uint8_t *puVar2;
  int iVar3;
  char *__s;
  size_t sVar4;
  s98deviceinfo *psVar5;
  uint32_t local_5c;
  int local_58;
  s98deviceinfo *info;
  int i;
  int dump_length;
  int loop_offset;
  int tag_offset;
  int dump_offset;
  int devices_size;
  int tag_length;
  char *title;
  int header_size;
  FILE *fp_local;
  s98c *ctx_local;
  
  __s = find_tag_value(ctx,"title");
  if (__s == (char *)0x0) {
    local_58 = 0;
  }
  else {
    sVar4 = strlen(__s);
    local_58 = (int)sVar4 + 1;
  }
  iVar3 = ((ctx->header).device_count + 1) * 0x10;
  loop_offset = iVar3 + 0x20 + local_58;
  if (__s == (char *)0x0) {
    local_5c = 0;
  }
  else {
    local_5c = iVar3 + 0x20;
  }
  i = 0;
  puVar1 = ctx->p;
  puVar2 = ctx->dump_buffer;
  if (ctx->loop_start != (uint8_t *)0x0) {
    i = loop_offset + ((int)ctx->loop_start - (int)ctx->dump_buffer);
  }
  if (ctx->dump_start != (uint8_t *)0x0) {
    loop_offset = loop_offset + ((int)ctx->dump_start - (int)ctx->dump_buffer);
  }
  (ctx->header).offset_to_tag = local_5c;
  (ctx->header).offset_to_dump = loop_offset;
  (ctx->header).offset_to_loop = i;
  fwrite("S98",1,3,(FILE *)fp);
  fputc((ctx->header).version + 0x30,(FILE *)fp);
  write_dword(fp,(ctx->header).timer_numerator);
  write_dword(fp,(ctx->header).timer_denominator);
  write_dword(fp,0);
  write_dword(fp,(ctx->header).offset_to_tag);
  write_dword(fp,(ctx->header).offset_to_dump);
  write_dword(fp,(ctx->header).offset_to_loop);
  write_dword(fp,0);
  for (info._4_4_ = 0; info._4_4_ < (ctx->header).device_count; info._4_4_ = info._4_4_ + 1) {
    psVar5 = ctx->devices + (int)info._4_4_;
    write_dword(fp,psVar5->device);
    write_dword(fp,psVar5->clock);
    write_dword(fp,psVar5->panpot);
    write_dword(fp,psVar5->reserved);
  }
  write_dword(fp,0);
  write_dword(fp,0);
  write_dword(fp,0);
  write_dword(fp,0);
  if (0 < local_58) {
    fwrite(__s,1,(long)local_58,(FILE *)fp);
  }
  fwrite(ctx->dump_buffer,1,(long)((int)puVar1 - (int)puVar2),(FILE *)fp);
  return 0;
}

Assistant:

int write_s98v2(struct s98c* ctx, FILE* fp)
{
    int header_size = 0x20; 
    char* title = find_tag_value(ctx, "title");
    int tag_length = (title == NULL) ? 0 : strlen(title) + 1;
    int devices_size = sizeof(struct s98deviceinfo) * (ctx->header.device_count + 1);
    int dump_offset = header_size + devices_size + tag_length;
    int tag_offset = (title == NULL) ? 0 : header_size + devices_size;
    int loop_offset = 0;
    int dump_length = ctx->p - ctx->dump_buffer;

    if(ctx->loop_start != NULL) {
        loop_offset = dump_offset + (ctx->loop_start - ctx->dump_buffer);
    }
    if(ctx->dump_start != NULL) {
        dump_offset += (ctx->dump_start - ctx->dump_buffer);
    }
    ctx->header.offset_to_tag = tag_offset;
    ctx->header.offset_to_dump = dump_offset;
    ctx->header.offset_to_loop = loop_offset;

    fwrite("S98", 1, 3, fp); // 0
    fputc('0' + ctx->header.version, fp); // 3
    write_dword(fp, ctx->header.timer_numerator); // 4
    write_dword(fp, ctx->header.timer_denominator); // 8
    write_dword(fp, 0); // c
    write_dword(fp, ctx->header.offset_to_tag); // 10 
    write_dword(fp, ctx->header.offset_to_dump); //14
    write_dword(fp, ctx->header.offset_to_loop); //18
    write_dword(fp, 0);

    int i;
    for(i = 0; i < ctx->header.device_count; i++) {
        struct s98deviceinfo* info = ctx->devices + i;

        write_dword(fp, info->device);
        write_dword(fp, info->clock);
        write_dword(fp, info->panpot);
        write_dword(fp, info->reserved);
    }
    write_dword(fp, s98NONE);
    write_dword(fp, 0);
    write_dword(fp, 0);
    write_dword(fp, 0);
    
    if(tag_length > 0) {
        fwrite(title, 1, tag_length, fp);
    }
        
    fwrite(ctx->dump_buffer, 1, dump_length, fp);

    return 0;
}